

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall
llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,fltSemantics *S,APInt *I)

{
  undefined8 *puVar1;
  anon_union_8_2_1313ab2f_for_U *paVar2;
  anon_union_8_2_1313ab2f_for_U local_50;
  undefined4 local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  undefined4 local_38;
  
  this->Semantics = S;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  paVar2 = &I->U;
  if (0x40 < I->BitWidth) {
    paVar2 = (anon_union_8_2_1313ab2f_for_U *)(I->U).pVal;
  }
  local_40 = *paVar2;
  local_38 = 0x40;
  APInt::clearUnusedBits((APInt *)&local_40);
  IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 2),(fltSemantics *)semIEEEdouble,(APInt *)&local_40);
  if (0x40 < I->BitWidth) {
    I = (APInt *)(I->U).VAL;
  }
  local_50 = *(anon_union_8_2_1313ab2f_for_U *)&I->BitWidth;
  local_48 = 0x40;
  APInt::clearUnusedBits((APInt *)&local_50);
  IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 6),(fltSemantics *)semIEEEdouble,(APInt *)&local_50);
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)(puVar1 + 1);
  APInt::~APInt((APInt *)&local_50);
  APInt::~APInt((APInt *)&local_40);
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf21,
                "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, const APInt &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S, const APInt &I)
    : Semantics(&S),
      Floats(new APFloat[2]{
          APFloat(semIEEEdouble, APInt(64, I.getRawData()[0])),
          APFloat(semIEEEdouble, APInt(64, I.getRawData()[1]))}) {
  assert(Semantics == &semPPCDoubleDouble);
}